

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_cast_double_test.cpp
# Opt level: O1

void __thiscall
reflect_value_cast_double_test_double_to_float_cast_Test::TestBody
          (reflect_value_cast_double_test_double_to_float_cast_Test *this)

{
  undefined8 uVar1;
  char *message;
  AssertionResult gtest_ar;
  float local_40;
  undefined4 uStack_3c;
  AssertHelper local_38;
  double local_30;
  internal local_28 [8];
  undefined8 *local_20;
  
  uVar1 = value_create_double(0x405393ff2e48e8a7);
  local_30 = (double)value_to_double(uVar1);
  uVar1 = value_type_cast(uVar1,5);
  local_40 = (float)local_30;
  local_38.data_._0_4_ = value_to_float(uVar1);
  testing::internal::CmpHelperEQ<float,float>
            (local_28,"(float)d","(float)value_to_float(v)",&local_40,(float *)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_20;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_value_cast_test/source/reflect_value_cast_double_test.cpp"
               ,0x68,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT44(uStack_3c,local_40) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_3c,local_40) + 8))();
    }
  }
  if (local_20 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_20 != local_20 + 2) {
      operator_delete((undefined8 *)*local_20);
    }
    operator_delete(local_20);
  }
  value_destroy(uVar1);
  return;
}

Assistant:

TEST_F(reflect_value_cast_double_test, double_to_float_cast)
{
	value v = value_create_double(78.31245);

	double d = value_to_double(v);

	v = value_type_cast(v, TYPE_FLOAT);

	EXPECT_EQ((float)d, (float)value_to_float(v));

	value_destroy(v);
}